

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O3

int auth_kbdint_responses(AuthPolicy *ap,ptrlen *responses)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  iVar2 = ap->kbdint_state;
  if (iVar2 != 1) {
    iVar4 = -1;
    bVar5 = iVar2 == 0;
    iVar3 = 0;
    iVar2 = iVar4;
    if (bVar5) {
      _Var1 = ptrlen_eq_string(*responses,"stoat");
      iVar3 = 0;
      if (_Var1) {
        _Var1 = ptrlen_eq_string(responses[1],"weasel");
        if (_Var1) {
          iVar3 = ap->kbdint_state + 1;
          iVar2 = 0;
        }
      }
    }
    ap->kbdint_state = iVar3;
  }
  return iVar2;
}

Assistant:

int auth_kbdint_responses(AuthPolicy *ap, const ptrlen *responses)
{
    switch (ap->kbdint_state) {
      case 0:
        if (ptrlen_eq_string(responses[0], "stoat") &&
            ptrlen_eq_string(responses[1], "weasel")) {
            ap->kbdint_state++;
            return 0;                  /* those are the expected responses */
        } else {
            ap->kbdint_state = 0;
            return -1;
        }
        break;
      case 1:
        return +1;                     /* succeed after the zero-prompt step */
      default:
        ap->kbdint_state = 0;
        return -1;
    }
}